

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O2

string * __thiscall
cursespp::NumberValidator<double>::ErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NumberValidator<double> *this)

{
  allocator<char> local_69;
  double local_68;
  double local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_60 = this->minimum;
  local_68 = this->maximum;
  f8n::i18n::Locale::Instance();
  if (((local_60 == 2.2250738585072014e-308) && (!NAN(local_60))) ||
     ((local_68 == 1.79769313486232e+308 && (!NAN(local_68))))) {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
  }
  else {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"{{minimum}}",&local_69);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()(&local_58,&this->formatter,this->minimum);
    f8n::str::replace(__return_storage_ptr__,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"{{maximum}}",&local_69);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
    ::operator()(&local_58,&this->formatter,this->maximum);
    f8n::str::replace(__return_storage_ptr__,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ErrorMessage() const override {
            if (bounded(minimum, maximum)) {
                std::string result = _TSTR("validator_dialog_number_parse_bounded_error");
                f8n::str::replace(result, "{{minimum}}", formatter(minimum));
                f8n::str::replace(result, "{{maximum}}", formatter(maximum));
                return result;
            }
            return _TSTR("validator_dialog_number_parse_error");
        }